

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeverityControl.cpp
# Opt level: O0

int f(void)

{
  Severity SVar1;
  SessionWriter *pSVar2;
  Session *this;
  uint64_t _binlog_sid_v;
  memory_order __b;
  memory_order __b_1;
  char (*in_stack_fffffffffffffe38) [23];
  EventSource *in_stack_fffffffffffffe40;
  __atomic_base<unsigned_long> eventSourceId;
  atomic<unsigned_long> *in_stack_fffffffffffffe50;
  EventSource *eventSource;
  undefined1 local_111;
  cx_string<0UL> local_110;
  allocator local_10f;
  allocator local_10e;
  allocator local_10d [20];
  allocator local_f9;
  undefined8 local_f8;
  undefined2 local_f0;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  undefined8 local_88;
  string local_80 [32];
  string local_60 [32];
  __atomic_base<unsigned_long> local_40;
  __atomic_base<unsigned_long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __int_type local_10;
  atomic<unsigned_long> *local_8;
  
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x1024ac);
  if (SVar1 < 0x201) {
    local_28 = &f::_binlog_sid;
    local_2c = 0;
    local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_38 = f::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_40 = f::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (f::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_f8 = 0;
      local_f0 = 0x200;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"main",&local_f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"f",local_10d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_10e);
      local_88 = 0xc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"Unexpected call to f()",&local_10f);
      local_110 = binlog::detail::concatenated_tags<char_const(&)[23]>(in_stack_fffffffffffffe38);
      this = (Session *)mserialize::cx_string<0UL>::data(&local_110);
      eventSource = (EventSource *)&local_111;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,(char *)this,(allocator *)eventSource);
      local_40._M_i = binlog::Session::addEventSource(this,eventSource);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffe40);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::allocator<char>::~allocator((allocator<char> *)&local_10f);
      std::allocator<char>::~allocator((allocator<char> *)&local_10e);
      std::allocator<char>::~allocator((allocator<char> *)local_10d);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      local_8 = &f::_binlog_sid;
      local_10 = local_40._M_i;
      local_14 = 5;
      in_stack_fffffffffffffe50 = &f::_binlog_sid;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10;
      if (local_14 == 3) {
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe50)->_session)->
        _M_i = local_10;
      }
      else if (local_14 == 5) {
        LOCK();
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe50)->_session)->
        _M_i = local_10;
        UNLOCK();
      }
      else {
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe50)->_session)->
        _M_i = local_10;
      }
    }
    pSVar2 = binlog::default_thread_local_writer();
    eventSourceId._M_i = local_40._M_i;
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[23]>
              ((SessionWriter *)in_stack_fffffffffffffe50,eventSourceId._M_i,(uint64_t)pSVar2,
               in_stack_fffffffffffffe38);
  }
  return 0;
}

Assistant:

int f()
{
  BINLOG_ERROR("Unexpected call to f()");
  return 0;
}